

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O3

bool __thiscall
slang::ast::UnbasedUnsizedIntegerLiteral::propagateType
          (UnbasedUnsizedIntegerLiteral *this,ASTContext *param_1,Type *newType)

{
  bool bVar1;
  bitwidth_t bVar2;
  
  bVar1 = Type::isIntegral(newType);
  if (!bVar1) {
    assert::assertFailed
              ("newType.isIntegral()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/LiteralExpressions.cpp"
               ,0x90,
               "bool slang::ast::UnbasedUnsizedIntegerLiteral::propagateType(const ASTContext &, const Type &)"
              );
  }
  bVar2 = Type::getBitWidth(newType);
  if (bVar2 != 0) {
    (this->super_Expression).type.ptr = newType;
    return true;
  }
  assert::assertFailed
            ("newType.getBitWidth()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/LiteralExpressions.cpp"
             ,0x91,
             "bool slang::ast::UnbasedUnsizedIntegerLiteral::propagateType(const ASTContext &, const Type &)"
            );
}

Assistant:

bool UnbasedUnsizedIntegerLiteral::propagateType(const ASTContext&, const Type& newType) {
    ASSERT(newType.isIntegral());
    ASSERT(newType.getBitWidth());

    type = &newType;
    return true;
}